

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::DateCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_38;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_28;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  switch(target->id_) {
  case TIMESTAMP_SEC:
    local_28._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastLoop<duckdb::date_t,duckdb::timestamp_t,duckdb::TryCastToTimestampSec>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_28,(init_cast_local_state_t)0x0);
    if (local_28._M_head_impl != (BoundCastData *)0x0) {
      (*(local_28._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_MS:
    local_30._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastLoop<duckdb::date_t,duckdb::timestamp_t,duckdb::TryCastToTimestampMS>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_30,(init_cast_local_state_t)0x0);
    if (local_30._M_head_impl != (BoundCastData *)0x0) {
      (*(local_30._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_NS:
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastLoop<duckdb::date_t,duckdb::timestamp_ns_t,duckdb::TryCastToTimestampNS>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    if (local_20._M_head_impl != (BoundCastData *)0x0) {
      (*(local_20._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case DECIMAL:
  case FLOAT:
  case DOUBLE:
  case CHAR:
switchD_00f0ab31_caseD_15:
    local_38._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_38,(init_cast_local_state_t)0x0);
    if (local_38._M_head_impl != (BoundCastData *)0x0) {
      (*(local_38._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case VARCHAR:
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::date_t,duckdb::StringCast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    if (local_10._M_head_impl != (BoundCastData *)0x0) {
      (*(local_10._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  default:
    if (target->id_ != TIMESTAMP_TZ) goto switchD_00f0ab31_caseD_15;
  case TIMESTAMP:
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::TryCastLoop<duckdb::date_t,duckdb::timestamp_t,duckdb::TryCast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_18,(init_cast_local_state_t)0x0);
    if (local_18._M_head_impl != (BoundCastData *)0x0) {
      (*(local_18._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::DateCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// date to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<date_t, duckdb::StringCast>);
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		// date to timestamp
		return BoundCastInfo(&VectorCastHelpers::TryCastLoop<date_t, timestamp_t, duckdb::TryCast>);
	case LogicalTypeId::TIMESTAMP_NS:
		return BoundCastInfo(&VectorCastHelpers::TryCastLoop<date_t, timestamp_ns_t, duckdb::TryCastToTimestampNS>);
	case LogicalTypeId::TIMESTAMP_SEC:
		return BoundCastInfo(&VectorCastHelpers::TryCastLoop<date_t, timestamp_t, duckdb::TryCastToTimestampSec>);
	case LogicalTypeId::TIMESTAMP_MS:
		return BoundCastInfo(&VectorCastHelpers::TryCastLoop<date_t, timestamp_t, duckdb::TryCastToTimestampMS>);
	default:
		return TryVectorNullCast;
	}
}